

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlog.cpp
# Opt level: O0

void vm_log_fmt(char *fmt,...)

{
  char in_AL;
  char *__s;
  size_t in_XMM2_Qa;
  char *in_XMM2_Qb;
  char *str;
  va_list args;
  __va_list_tag *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff68 = in_XMM2_Qa;
    in_stack_ffffffffffffff70 = in_XMM2_Qb;
  }
  __s = t3vsprintf_alloc(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  strlen(__s);
  vm_log(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  free(__s);
  return;
}

Assistant:

void vm_log_fmt(VMG_ const char *fmt, ...)
{
    /* format the message */
    va_list args;
    va_start(args, fmt);
    char *str = t3vsprintf_alloc(fmt, args);
    va_end(args);

    /* log the message */
    vm_log(vmg_ str, strlen(str));

    /* done with the string */
    t3free(str);
}